

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Shop::addNewSale(Shop *this)

{
  ostream *poVar1;
  int index;
  int quantity;
  int ignore;
  string date;
  string name;
  Medicine medicine;
  Sale s;
  int local_294;
  int local_290;
  int local_28c;
  string local_288;
  string local_268;
  Medicine local_248;
  Sale local_1b8;
  Sale local_e0;
  
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Select the index of Medicine which you want to sell:");
  std::endl<char,std::char_traits<char>>(poVar1);
  printMedicines(this);
  std::istream::operator>>((istream *)&std::cin,&local_294);
  poVar1 = std::operator<<((ostream *)&std::cout,"Your selected Medicine is:");
  std::endl<char,std::char_traits<char>>(poVar1);
  printMedicine(this,local_294 + -1);
  Medicine::Medicine(&local_248,
                     (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)local_294 + -1);
  local_248.isSold = true;
  local_248.quantity = local_248.quantity + -1;
  Medicine::operator=((this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                      _M_impl.super__Vector_impl_data._M_start + (long)local_294 + -1,&local_248);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Customer Name:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,(string *)&local_268);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Date:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,(string *)&local_288);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Quantity:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,&local_290);
  Sale::Sale(&local_1b8,
             (int)(((long)(this->salesList).super__Vector_base<Sale,_std::allocator<Sale>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->salesList).super__Vector_base<Sale,_std::allocator<Sale>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0xd8) + 1,local_290,&local_288,
             &local_268,&local_248);
  poVar1 = std::operator<<((ostream *)&std::cout,"Your New Sell Summery is:");
  std::endl<char,std::char_traits<char>>(poVar1);
  Sale::Sale(&local_e0,&local_1b8);
  printSale(this,&local_e0);
  Sale::~Sale(&local_e0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Press any kew to Confirm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,&local_28c);
  std::vector<Sale,_std::allocator<Sale>_>::push_back(&this->salesList,&local_1b8);
  Sale::~Sale(&local_1b8);
  Medicine::~Medicine(&local_248);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  return;
}

Assistant:

void addNewSale() {
        int index, ignore;
        int quantity;
        string name, date;

        cout << "Select the index of Medicine which you want to sell:" << endl;
        printMedicines();
        cin >> index;
        cout << "Your selected Medicine is:" << endl;
        printMedicine(index - 1);

        Medicine medicine = medicineList[index - 1];
        medicine.isSold = true;
        medicine.quantity--;
        medicineList[index - 1] = medicine;

        cout << "Enter Customer Name:" << endl;
        cin >> name;
        cout << "Enter Date:" << endl;
        cin >> date;
        cout << "Enter Quantity:" << endl;
        cin >> quantity;
        Sale s = Sale(salesList.size() + 1, quantity, date, name, medicine);

        cout << "Your New Sell Summery is:" << endl;
        printSale(s);

        cout << "Press any kew to Confirm:" << endl;
        cin >> ignore;
        salesList.push_back(s);

    }